

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exttpose.cc
# Opt level: O1

void __thiscall
Exttpose::sort_get_l2
          (Exttpose *this,int *l2cnt,fstream *file,ofstream *ofd,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *cntary,bool use_seq)

{
  byte bVar1;
  pointer piVar2;
  ExttposeArgument *pEVar3;
  unsigned_long flen;
  ulong uVar4;
  ulong uVar5;
  runtime_error *this_00;
  ulong uVar6;
  ulong uVar7;
  int *unaff_RBP;
  int iVar8;
  int *piVar9;
  Exttpose *pEVar10;
  ulong uVar11;
  int itbuf [3];
  int local_7c;
  ofstream *local_78;
  Exttpose *local_70;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_68;
  int local_5c;
  int local_58;
  int local_54;
  ulong local_50;
  undefined8 local_48;
  ulong local_40;
  int *local_38;
  
  local_78 = ofd;
  local_70 = this;
  local_68 = cntary;
  local_38 = l2cnt;
  flen = file_size(file);
  if (flen != 0) {
    unaff_RBP = read_file(file,flen);
    if (((byte)file[*(long *)(*(long *)file + -0x18) + 0x20] & 5) != 0) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Error reading file.");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    qsort(unaff_RBP,flen >> 3,8,cmp2it);
  }
  local_48 = 4;
  uVar4 = flen / 4;
  local_7c = 0;
  if (local_70->numfreq != 0) {
    iVar8 = 0;
    pEVar10 = local_70;
    uVar11 = 0;
    do {
      local_50 = uVar11 + 1;
      uVar5 = pEVar10->numfreq;
      uVar7 = local_50 & 0xffffffff;
      if (pEVar10->args->use_seq != 0) {
        uVar7 = 0;
      }
      if (uVar7 < uVar5) {
        local_40 = ~uVar11;
        do {
          local_7c = 0;
          if (((flen != 0) && (uVar6 = (ulong)iVar8, uVar6 < uVar4)) && (uVar6 < uVar4)) {
            piVar2 = (pEVar10->freqidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            do {
              iVar8 = local_7c + 0x100;
              if ((uVar11 != (uint)piVar2[unaff_RBP[uVar6]]) ||
                 (uVar7 != (uint)piVar2[unaff_RBP[uVar6 + 1]])) break;
              uVar6 = uVar6 + 2;
              local_7c = iVar8;
            } while (uVar6 < uVar4);
            iVar8 = (int)uVar6;
          }
          pEVar3 = pEVar10->args;
          if (pEVar3->use_seq == 0) {
            bVar1 = (local_68->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start
                    [(int)local_40 + (int)uVar7 +
                     (pEVar10->offsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[uVar11]];
          }
          else {
            bVar1 = (local_68->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                    _M_impl.super__Vector_impl_data._M_start[uVar7 + uVar5 * uVar11];
          }
          local_7c = (uint)bVar1 + local_7c;
          if (pEVar3->MINSUPPORT <= (long)local_7c) {
            if (pEVar3->write_only_fcnt == 0) {
              piVar2 = (pEVar10->backidx).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
              local_5c = piVar2[uVar11];
              local_58 = piVar2[uVar7];
              piVar9 = &local_5c;
              local_54 = local_7c;
            }
            else {
              piVar9 = &local_7c;
            }
            std::ostream::write((char *)local_78,(long)piVar9);
            *local_38 = *local_38 + 1;
            pEVar10 = local_70;
          }
          uVar7 = uVar7 + 1;
          uVar5 = pEVar10->numfreq;
        } while (uVar7 < uVar5);
      }
      uVar11 = local_50;
    } while (local_50 < pEVar10->numfreq);
  }
  if (unaff_RBP != (int *)0x0 && flen != 0) {
    operator_delete__(unaff_RBP);
  }
  return;
}

Assistant:

void Exttpose::sort_get_l2(int &l2cnt, fstream &file, ofstream &ofd, vector<unsigned char> &cntary, bool use_seq) {
    //write 2-itemsets counts to file

    int i, j, k;
    int fcnt;
    int lit;
    int itbuf[3];
    int *sortary;

    unsigned long filesize = file_size(file);

    if (filesize > 0) {
        sortary = read_file(file, filesize);

        if (!file) {
            throw runtime_error("Error reading file.");
        }
        qsort(sortary, (filesize / sizeof(int)) / 2, 2 * INT_SIZE, cmp2it);
    }

    unsigned long numel = filesize / INT_SIZE;
    i = 0;
    fcnt = 0;
    for (j = 0; j < numfreq; j++) {
        if (args.use_seq) k = 0;
        else k = j + 1;
        for (; k < numfreq; k++) {
            fcnt = 0;
            if (filesize > 0 && i < numel) {
                while (i < numel &&
                       j == freqidx[sortary[i]] && k == freqidx[sortary[i + 1]]) {
                    fcnt += 256;
                    i += 2;
                }
            }
            if (args.use_seq) fcnt += (int) cntary[j * numfreq + k];
            else {
                lit = j;
                lit = (offsets[lit] - lit - 1);
                fcnt += (int) cntary[lit + k];
            }

            if (fcnt >= args.MINSUPPORT) {
                if (args.write_only_fcnt) {
                    ofd.write((char *) &fcnt, INT_SIZE);
                } else {
                    itbuf[0] = backidx[j];
                    itbuf[1] = backidx[k];
                    itbuf[2] = fcnt;
                    ofd.write((char *) itbuf, 3 * sizeof(int));
                }
                l2cnt++;
            }
        }
    }
    if (filesize > 0) delete[] sortary;
}